

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O0

void __thiscall FC_BPNN::setLearningStep(FC_BPNN *this,double a)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  reference ppVar3;
  pair<const_unsigned_long,_Preceptron_*> *element;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int i;
  double a_local;
  FC_BPNN *this_local;
  
  __range2._4_4_ = 0;
  while( true ) {
    sVar2 = std::
            vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
            ::size(&this->net);
    if (sVar2 <= (ulong)(long)__range2._4_4_) break;
    this_00 = std::
              vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
              ::operator[](&this->net,(long)__range2._4_4_);
    __end2 = std::
             map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
             ::begin(this_00);
    element = (pair<const_unsigned_long,_Preceptron_*> *)
              std::
              map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
              ::end(this_00);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&element);
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Preceptron_*>_>::operator*
                         (&__end2);
      ppVar3->second->learning_step = a;
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Preceptron_*>_>::operator++(&__end2);
    }
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  return;
}

Assistant:

void FC_BPNN::setLearningStep(double a)
{
	for (int i = 0; i < net.size(); i++) {
		for (auto& element : net[i]) {
			element.second->learning_step = a;
		}
	}
}